

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error astcenc_get_block_info(astcenc_context *ctxo,uint8_t *data,astcenc_block_info *info)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  quant_method qVar22;
  uint uVar23;
  int iVar24;
  undefined4 *in_RDX;
  undefined4 *in_RDI;
  undefined1 auVar25 [16];
  uint i_2;
  uint i_1;
  int weight_plane2 [216];
  int weight_plane1 [216];
  vint4 datai;
  vint4 color_unorm;
  vint4 color_lns;
  int j;
  vmask4 hdr_mask;
  vint4 endpnt [2];
  bool a_hdr;
  bool rgb_hdr;
  uint i;
  decimation_info *di;
  block_mode *bm;
  partition_info *pi;
  int partition_count;
  block_size_descriptor *bsd;
  symbolic_compressed_block scb;
  astcenc_contexti *ctx;
  uint in_stack_ffffffffffffd3f4;
  block_size_descriptor *in_stack_ffffffffffffd3f8;
  uint in_stack_ffffffffffffd400;
  byte bVar26;
  undefined4 in_stack_ffffffffffffd404;
  undefined4 in_stack_ffffffffffffd408;
  undefined4 in_stack_ffffffffffffd40c;
  int local_2bf0 [82];
  symbolic_compressed_block *in_stack_ffffffffffffd558;
  uint8_t *in_stack_ffffffffffffd560;
  block_size_descriptor *in_stack_ffffffffffffd568;
  vint4 *in_stack_ffffffffffffd700;
  bool *in_stack_ffffffffffffd708;
  bool *in_stack_ffffffffffffd710;
  uint8_t *in_stack_ffffffffffffd718;
  int in_stack_ffffffffffffd720;
  astcenc_profile in_stack_ffffffffffffd724;
  int local_2890 [134];
  int *in_stack_ffffffffffffd988;
  int *in_stack_ffffffffffffd990;
  undefined1 in_stack_ffffffffffffd99f;
  decimation_info *in_stack_ffffffffffffd9a0;
  symbolic_compressed_block *in_stack_ffffffffffffd9a8;
  block_size_descriptor *in_stack_ffffffffffffd9b0;
  int local_2484;
  undefined1 local_2480 [16];
  undefined8 local_2470 [4];
  byte local_244e;
  byte local_244d;
  uint local_244c;
  decimation_info *local_2448;
  block_mode *local_2440;
  partition_info *local_2438;
  uint local_242c;
  block_size_descriptor *local_2428;
  symbolic_compressed_block local_2420;
  undefined4 *local_2388;
  undefined4 *local_2380;
  undefined1 local_2360 [20];
  byte local_234c;
  byte local_234b;
  byte local_234a;
  byte local_2349;
  undefined1 *local_2348;
  undefined1 local_2340 [16];
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 local_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 local_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 local_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined1 local_2210 [16];
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 local_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined1 local_21b0 [16];
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 local_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 local_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 local_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 local_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined1 local_2080 [16];
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined1 local_2010 [16];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 local_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fb0;
  vint4 *pvStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f90;
  vint4 *pvStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined1 local_1f60 [16];
  undefined8 local_1f50;
  vint4 *pvStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined1 local_1f30 [16];
  undefined8 local_1f20;
  vint4 *in_stack_ffffffffffffe0e8;
  undefined1 local_1ee0 [16];
  undefined8 local_1ed0;
  vint4 *pvStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined1 local_1e70 [16];
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 local_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1e20 [16];
  undefined8 local_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 local_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined1 local_1dd0 [16];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 local_1d90;
  undefined8 uStack_1d88;
  undefined1 local_1d80 [16];
  undefined8 local_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 local_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined1 local_1d30 [24];
  undefined8 *local_1d18;
  undefined8 local_1d10;
  undefined8 uStack_1d08;
  undefined1 local_1d00 [16];
  undefined1 local_1cf0 [16];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined1 local_1cd0 [16];
  undefined1 local_1cc0 [16];
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined4 local_1c94;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined1 *local_1c58;
  undefined1 local_1c50 [16];
  undefined1 *local_1c38;
  undefined1 local_1c30 [16];
  undefined1 *local_1c18;
  undefined1 local_1c10 [16];
  undefined1 *local_1bf8;
  undefined1 local_1bf0 [16];
  undefined1 *local_1bd8;
  undefined1 local_1bd0 [16];
  undefined1 *local_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 *local_1b58;
  undefined4 local_1b4c;
  undefined1 *local_1b48;
  undefined4 local_1b3c;
  undefined1 *local_1b38;
  undefined4 local_1b2c;
  undefined1 *local_1b28;
  undefined4 local_1b1c;
  undefined1 *local_1b18;
  undefined4 local_1b0c;
  undefined1 *local_1b08;
  undefined4 local_1afc;
  undefined1 *local_1af8;
  undefined4 local_1aec;
  undefined1 *local_1ae8;
  undefined4 local_1adc;
  undefined1 *local_1ad8;
  undefined4 local_1acc;
  undefined1 *local_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined4 local_1a94;
  undefined4 local_1a90;
  undefined4 local_1a8c;
  undefined4 local_1a88;
  undefined4 local_1a84;
  undefined4 local_1a80;
  undefined4 local_1a7c;
  undefined4 local_1a78;
  undefined4 local_1a74;
  undefined1 local_1a70 [16];
  undefined4 local_1a60;
  undefined4 local_1a5c;
  undefined4 local_1a58;
  undefined4 local_1a54;
  undefined1 local_1a50 [16];
  undefined4 local_1a40;
  undefined4 local_1a3c;
  undefined4 local_1a38;
  undefined4 local_1a34;
  undefined1 local_1a30 [16];
  undefined4 local_1a20;
  undefined4 local_1a1c;
  undefined4 local_1a18;
  undefined4 local_1a14;
  undefined1 local_1a10 [16];
  undefined4 local_1a00;
  undefined4 local_19fc;
  undefined4 local_19f8;
  undefined4 local_19f4;
  undefined1 local_19f0 [16];
  undefined4 local_19e0;
  undefined4 local_19dc;
  undefined4 local_19d8;
  undefined4 local_19d4;
  undefined1 local_19d0 [16];
  undefined4 local_19c0;
  undefined4 local_19bc;
  undefined4 local_19b8;
  undefined4 local_19b4;
  undefined1 local_19b0 [16];
  undefined4 local_19a0;
  undefined4 local_199c;
  undefined4 local_1998;
  undefined4 local_1994;
  undefined1 local_1990 [16];
  undefined4 local_1980;
  undefined4 local_197c;
  undefined4 local_1978;
  undefined4 local_1974;
  undefined1 local_1970 [16];
  undefined4 local_1960;
  undefined4 local_195c;
  undefined4 local_1958;
  undefined4 local_1954;
  undefined1 local_1950 [16];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined4 local_1924;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 local_1910;
  undefined8 uStack_1908;
  undefined4 local_18f4;
  undefined1 *local_18f0;
  undefined4 local_18e4;
  undefined1 local_18e0 [16];
  undefined4 local_18d0;
  undefined4 local_18cc;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined1 local_18c0 [16];
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined4 local_1894;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined4 local_1864;
  undefined1 *local_1860;
  undefined4 local_1854;
  undefined1 local_1850 [16];
  undefined4 local_1840;
  undefined4 local_183c;
  undefined4 local_1838;
  undefined4 local_1834;
  undefined1 local_1830 [16];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined4 local_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined4 local_17d4;
  undefined1 *local_17d0;
  undefined4 local_17c4;
  undefined1 local_17c0 [16];
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined1 local_1780 [16];
  undefined1 local_1770 [16];
  undefined1 *local_1758;
  undefined8 local_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined1 local_1730 [16];
  undefined1 local_1720 [16];
  undefined1 *local_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined1 local_16e0 [16];
  undefined1 local_16d0 [16];
  undefined1 *local_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 *local_1618;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined1 local_15f0 [16];
  undefined1 local_15e0 [16];
  undefined1 *local_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 *local_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined1 *local_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  int local_1438;
  int local_1434;
  int local_1430;
  uint local_142c;
  undefined1 *local_1428;
  undefined1 local_1420 [16];
  uint local_1410;
  int local_140c;
  int local_1408;
  int local_1404;
  undefined1 local_1400 [16];
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined4 local_13d4;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined4 local_13a4;
  undefined1 *local_13a0;
  undefined4 local_1394;
  undefined1 local_1390 [16];
  undefined4 local_1380;
  undefined4 local_137c;
  undefined4 local_1378;
  undefined4 local_1374;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 *local_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 *local_12d0;
  undefined4 local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined4 local_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined4 local_1254;
  undefined1 *local_1250;
  undefined4 local_1244;
  undefined1 local_1240 [16];
  undefined4 local_1230;
  undefined4 local_122c;
  undefined4 local_1228;
  undefined4 local_1224;
  undefined1 local_1220 [16];
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined4 local_11f4;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined4 local_11c4;
  undefined1 *local_11c0;
  undefined4 local_11b4;
  undefined1 local_11b0 [16];
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  undefined1 local_1190 [16];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined4 local_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined4 local_1134;
  undefined1 *local_1130;
  undefined4 local_1124;
  undefined1 local_1120 [16];
  undefined4 local_1110;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  vint4 *pvStack_10e8;
  undefined1 local_10e0 [16];
  undefined8 local_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 local_10b0 [16];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [16];
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined1 local_1060 [16];
  undefined1 local_1050 [16];
  undefined1 *local_1040;
  undefined4 local_1034;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 *local_ff0;
  undefined4 local_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [16];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0;
  undefined4 local_f94;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [16];
  undefined1 local_f50 [16];
  undefined1 *local_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined1 local_f10 [16];
  undefined1 local_f00 [16];
  undefined1 *local_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [16];
  undefined1 *local_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined1 local_e70 [16];
  undefined1 local_e60 [16];
  undefined1 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  vint4 *pvStack_e28;
  undefined1 local_e20 [16];
  undefined1 local_e10 [16];
  undefined1 *local_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  vint4 *pvStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  vint4 *pvStack_d18;
  undefined1 local_d10 [16];
  undefined1 *local_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [16];
  undefined1 *local_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined1 local_cb0 [16];
  undefined1 *local_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  vint4 *pvStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  vint4 *pvStack_bf8;
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 *local_bd0;
  undefined4 local_bc4;
  undefined8 local_bc0;
  vint4 *pvStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  vint4 *pvStack_b98;
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  vint4 *pvStack_ac8;
  undefined8 local_ac0;
  vint4 *pvStack_ab8;
  ulong local_ab0;
  ulong uStack_aa8;
  ulong local_aa0;
  ulong uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 *local_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined4 local_a04;
  undefined1 *local_a00;
  undefined4 local_9f4;
  undefined1 local_9f0 [16];
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [16];
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 *local_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 *local_958;
  undefined8 local_950;
  vint4 *pvStack_948;
  ulong local_940;
  ulong uStack_938;
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 *local_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 *local_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined4 local_874;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  vint4 *pvStack_858;
  ulong local_850;
  ulong uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined1 local_7d0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined1 local_770 [16];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined4 local_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 *local_688;
  int local_680;
  int iStack_67c;
  int iStack_678;
  int iStack_674;
  undefined1 *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined4 local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 *local_5e8;
  undefined4 local_5dc;
  undefined1 *local_5d8;
  undefined4 local_5cc;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_598;
  undefined4 local_594;
  undefined1 local_590 [16];
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined1 local_570 [16];
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 local_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 *local_480;
  undefined4 local_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  vint4 *pvStack_448;
  ulong local_440;
  ulong uStack_438;
  undefined1 local_430 [16];
  ulong local_420;
  ulong uStack_418;
  undefined1 *local_410;
  undefined4 local_404;
  undefined1 local_400 [16];
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined8 local_3e0;
  vint4 *pvStack_3d8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 *local_3b0;
  undefined4 local_3a4;
  undefined8 local_3a0;
  vint4 *pvStack_398;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 local_348;
  undefined4 local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined4 local_314;
  undefined1 *local_310;
  undefined4 local_304;
  undefined1 *local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined1 local_2f0 [16];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined1 local_2d0 [16];
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong local_230;
  ulong uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  ulong local_40;
  undefined8 uStack_38;
  
  local_2388 = in_RDI;
  local_2380 = in_RDX;
  physical_to_symbolic
            (in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,in_stack_ffffffffffffd558);
  local_2428 = *(block_size_descriptor **)(local_2388 + 0x20);
  memset(local_2380,0,0x860);
  *local_2380 = *local_2388;
  local_2380[1] = local_2388[2];
  local_2380[2] = local_2388[3];
  local_2380[3] = local_2388[4];
  local_2380[4] = (uint)local_2428->texel_count;
  *(bool *)(local_2380 + 5) = local_2420.block_type == '\0';
  if ((*(byte *)(local_2380 + 5) & 1) == 0) {
    uVar23 = CONCAT13(1,(int3)in_stack_ffffffffffffd404);
    if (local_2420.block_type != '\x01') {
      uVar23 = CONCAT13(local_2420.block_type == '\x02',(int3)in_stack_ffffffffffffd404);
    }
    *(char *)((long)local_2380 + 0x15) = (char)(uVar23 >> 0x18);
    if ((*(byte *)((long)local_2380 + 0x15) & 1) == 0) {
      local_242c = (uint)local_2420.partition_count;
      local_2438 = block_size_descriptor::get_partition_info
                             ((block_size_descriptor *)
                              CONCAT44(in_stack_ffffffffffffd40c,in_stack_ffffffffffffd408),uVar23,
                              in_stack_ffffffffffffd400);
      local_2440 = block_size_descriptor::get_block_mode
                             (in_stack_ffffffffffffd3f8,in_stack_ffffffffffffd3f4);
      local_2448 = block_size_descriptor::get_decimation_info
                             (local_2428,(uint)local_2440->decimation_mode);
      local_2380[0xf] = (uint)local_2448->weight_x;
      local_2380[0x10] = (uint)local_2448->weight_y;
      local_2380[0x11] = (uint)local_2448->weight_z;
      *(bool *)((long)local_2380 + 0x17) = (local_2440->field_0x5 & 1) != 0;
      local_2380[6] = (uint)local_2420.partition_count;
      local_2380[7] = (uint)local_2420.partition_index;
      local_2380[8] = (int)local_2420.plane2_component;
      qVar22 = symbolic_compressed_block::get_color_quant_mode(&local_2420);
      uVar23 = get_quant_level(qVar22);
      local_2380[0xd] = uVar23;
      qVar22 = block_mode::get_weight_quant_mode(local_2440);
      uVar23 = get_quant_level(qVar22);
      local_2380[0xe] = uVar23;
      for (local_244c = 0; local_244c < local_2420.partition_count; local_244c = local_244c + 1) {
        unpack_color_endpoints
                  (in_stack_ffffffffffffd724,in_stack_ffffffffffffd720,in_stack_ffffffffffffd718,
                   in_stack_ffffffffffffd710,in_stack_ffffffffffffd708,in_stack_ffffffffffffd700,
                   in_stack_ffffffffffffe0e8);
        local_2380[(ulong)local_244c + 9] = (uint)local_2420.color_formats[local_244c];
        bVar26 = 1;
        if (((*(byte *)((long)local_2380 + 0x16) & 1) == 0) && (bVar26 = 1, (local_244d & 1) == 0))
        {
          bVar26 = local_244e;
        }
        *(byte *)((long)local_2380 + 0x16) = bVar26 & 1;
        local_2348 = local_2480;
        local_2349 = local_244d & 1;
        local_234a = local_2349;
        local_234b = local_2349;
        local_234c = local_244e & 1;
        local_1410 = -(uint)local_2349;
        local_140c = -(uint)local_2349;
        local_1408 = -(uint)local_2349;
        local_1404 = -(uint)(local_244e & 1);
        local_1428 = local_2360;
        local_142c = local_1410;
        local_1430 = local_140c;
        local_1434 = local_1408;
        local_1438 = local_1404;
        auVar1 = vpinsrd_avx(ZEXT416(local_1410),local_140c,1);
        auVar1 = vpinsrd_avx(auVar1,local_1408,2);
        local_1420 = vpinsrd_avx(auVar1,local_1404,3);
        auVar1 = local_1420;
        local_1bb0 = local_1420._0_8_;
        uStack_1ba8 = local_1420._8_8_;
        for (local_2484 = 0; local_2484 < 2; local_2484 = local_2484 + 1) {
          local_13f0 = local_2470[(long)local_2484 * 2];
          uStack_13e8 = local_2470[(long)local_2484 * 2 + 1];
          local_2120 = local_13f0;
          uStack_2118 = uStack_13e8;
          local_2140 = local_13f0;
          uStack_2138 = uStack_13e8;
          local_13d4 = 0x7ff;
          local_13a0 = local_1400;
          local_13a4 = 0x7ff;
          local_1394 = 0x7ff;
          local_1374 = 0x7ff;
          local_1378 = 0x7ff;
          local_137c = 0x7ff;
          local_1380 = 0x7ff;
          auVar2 = vpinsrd_avx(ZEXT416(0x7ff),0x7ff,1);
          auVar2 = vpinsrd_avx(auVar2,0x7ff,2);
          local_1390 = vpinsrd_avx(auVar2,0x7ff,3);
          local_1370 = local_1390._0_8_;
          uStack_1368 = local_1390._8_8_;
          local_1320 = local_1390._0_8_;
          uStack_1318 = local_1390._8_8_;
          auVar2._8_8_ = uStack_13e8;
          auVar2._0_8_ = local_13f0;
          local_1340 = vpand_avx(auVar2,local_1390);
          local_1328 = local_1350;
          local_13c0 = local_1340._0_8_;
          uStack_13b8 = local_1340._8_8_;
          local_2130 = local_1340._0_8_;
          uStack_2128 = local_1340._8_8_;
          local_2160 = local_13f0;
          uStack_2158 = uStack_13e8;
          local_12c4 = 0xb;
          auVar3._8_8_ = uStack_13e8;
          auVar3._0_8_ = local_13f0;
          local_12e0 = vpsrld_avx(auVar3,ZEXT416(0xb));
          local_12d0 = local_12f0;
          local_2150 = local_12e0._0_8_;
          uStack_2148 = local_12e0._8_8_;
          local_2180 = local_1340._0_8_;
          uStack_2178 = local_1340._8_8_;
          local_1160 = local_1340._0_8_;
          uStack_1158 = local_1340._8_8_;
          local_1164 = 3;
          local_1180 = local_1340._0_8_;
          uStack_1178 = local_1340._8_8_;
          local_1130 = local_1190;
          local_1134 = 3;
          local_1124 = 3;
          local_1104 = 3;
          local_1108 = 3;
          local_110c = 3;
          local_1110 = 3;
          auVar2 = vpinsrd_avx(ZEXT416(3),3,1);
          auVar2 = vpinsrd_avx(auVar2,3,2);
          local_1120 = vpinsrd_avx(auVar2,3,3);
          local_f20 = local_1340._0_8_;
          uStack_f18 = local_1340._8_8_;
          local_f30 = local_1120._0_8_;
          uStack_f28 = local_1120._8_8_;
          local_d80 = local_1340._0_8_;
          uStack_d78 = local_1340._8_8_;
          local_d90 = local_1120._0_8_;
          uStack_d88 = local_1120._8_8_;
          local_f00 = vpmulld_avx(local_1340,local_1120);
          local_ee8 = local_f10;
          local_1150 = local_f00._0_8_;
          uStack_1148 = local_f00._8_8_;
          local_2170 = local_f00._0_8_;
          uStack_2168 = local_f00._8_8_;
          local_21a0 = local_1340._0_8_;
          uStack_2198 = local_1340._8_8_;
          local_1ac8 = local_21b0;
          local_1acc = 0x200;
          local_1a94 = 0x200;
          local_1954 = 0x200;
          local_1958 = 0x200;
          local_195c = 0x200;
          local_1960 = 0x200;
          auVar2 = vpinsrd_avx(ZEXT416(0x200),0x200,1);
          auVar2 = vpinsrd_avx(auVar2,0x200,2);
          local_1970 = vpinsrd_avx(auVar2,0x200,3);
          auVar25 = local_1970;
          local_1090 = local_1340._0_8_;
          uStack_1088 = local_1340._8_8_;
          local_10a0 = local_1970._0_8_;
          uStack_1098 = local_1970._8_8_;
          local_d60 = local_1340._0_8_;
          uStack_d58 = local_1340._8_8_;
          local_d70 = local_1970._0_8_;
          uStack_d68 = local_1970._8_8_;
          local_c30 = local_1970._0_8_;
          uStack_c28 = local_1970._8_8_;
          local_c40 = local_1340._0_8_;
          uStack_c38 = local_1340._8_8_;
          local_d10 = vpcmpgtd_avx(local_1970,local_1340);
          local_cf8 = local_1080;
          local_cf0 = local_d10._0_8_;
          uStack_ce8 = local_d10._8_8_;
          local_2190 = local_d10._0_8_;
          uStack_2188 = local_d10._8_8_;
          local_21e0 = local_1340._0_8_;
          uStack_21d8 = local_1340._8_8_;
          local_11f0 = local_1340._0_8_;
          uStack_11e8 = local_1340._8_8_;
          local_11f4 = 4;
          local_1210 = local_1340._0_8_;
          uStack_1208 = local_1340._8_8_;
          local_11c0 = local_1220;
          local_11c4 = 4;
          local_11b4 = 4;
          local_1194 = 4;
          local_1198 = 4;
          local_119c = 4;
          local_11a0 = 4;
          auVar2 = vpinsrd_avx(ZEXT416(4),4,1);
          auVar2 = vpinsrd_avx(auVar2,4,2);
          local_11b0 = vpinsrd_avx(auVar2,4,3);
          local_ed0 = local_1340._0_8_;
          uStack_ec8 = local_1340._8_8_;
          local_ee0 = local_11b0._0_8_;
          uStack_ed8 = local_11b0._8_8_;
          local_da0 = local_1340._0_8_;
          uStack_d98 = local_1340._8_8_;
          local_db0 = local_11b0._0_8_;
          uStack_da8 = local_11b0._8_8_;
          local_eb0 = vpmulld_avx(local_1340,local_11b0);
          local_e98 = local_ec0;
          local_11e0 = local_eb0._0_8_;
          uStack_11d8 = local_eb0._8_8_;
          local_21d0 = local_eb0._0_8_;
          uStack_21c8 = local_eb0._8_8_;
          local_1800 = local_eb0._0_8_;
          uStack_17f8 = local_eb0._8_8_;
          local_1804 = 0x200;
          local_1820 = local_eb0._0_8_;
          uStack_1818 = local_eb0._8_8_;
          local_17d0 = local_1830;
          local_17d4 = 0x200;
          local_17c4 = 0x200;
          local_17a4 = 0x200;
          local_17a8 = 0x200;
          local_17ac = 0x200;
          local_17b0 = 0x200;
          auVar2 = vpinsrd_avx(ZEXT416(0x200),0x200,1);
          auVar2 = vpinsrd_avx(auVar2,0x200,2);
          local_17c0 = vpinsrd_avx(auVar2,0x200,3);
          auVar16 = local_17c0;
          local_1650 = local_eb0._0_8_;
          uStack_1648 = local_eb0._8_8_;
          local_1660 = local_17c0._0_8_;
          uStack_1658 = local_17c0._8_8_;
          local_14b0 = local_eb0._0_8_;
          uStack_14a8 = local_eb0._8_8_;
          local_14c0 = local_17c0._0_8_;
          uStack_14b8 = local_17c0._8_8_;
          local_1630 = vpsubd_avx(local_eb0,local_17c0);
          local_1618 = local_1640;
          auVar18 = local_1630;
          local_17f0 = local_1630._0_8_;
          uStack_17e8 = local_1630._8_8_;
          local_21c0 = local_1630._0_8_;
          uStack_21b8 = local_1630._8_8_;
          local_2200 = local_1340._0_8_;
          uStack_21f8 = local_1340._8_8_;
          local_1ad8 = local_2210;
          local_1adc = 0x600;
          local_1a90 = 0x600;
          local_1974 = 0x600;
          local_1978 = 0x600;
          local_197c = 0x600;
          local_1980 = 0x600;
          auVar2 = vpinsrd_avx(ZEXT416(0x600),0x600,1);
          auVar2 = vpinsrd_avx(auVar2,0x600,2);
          local_1990 = vpinsrd_avx(auVar2,0x600,3);
          auVar14 = local_1990;
          local_10c0 = local_1340._0_8_;
          uStack_10b8 = local_1340._8_8_;
          local_10d0 = local_1990._0_8_;
          uStack_10c8 = local_1990._8_8_;
          local_d40 = local_1340._0_8_;
          uStack_d38 = local_1340._8_8_;
          local_d50 = local_1990._0_8_;
          uStack_d48 = local_1990._8_8_;
          local_c50 = local_1990._0_8_;
          uStack_c48 = local_1990._8_8_;
          local_c60 = local_1340._0_8_;
          uStack_c58 = local_1340._8_8_;
          local_ce0 = vpcmpgtd_avx(local_1990,local_1340);
          local_cc8 = local_10b0;
          local_cc0 = local_ce0._0_8_;
          uStack_cb8 = local_ce0._8_8_;
          local_21f0 = local_ce0._0_8_;
          uStack_21e8 = local_ce0._8_8_;
          local_2240 = local_1340._0_8_;
          uStack_2238 = local_1340._8_8_;
          local_1280 = local_1340._0_8_;
          uStack_1278 = local_1340._8_8_;
          local_1284 = 5;
          local_12a0 = local_1340._0_8_;
          uStack_1298 = local_1340._8_8_;
          local_1250 = local_12b0;
          local_1254 = 5;
          local_1244 = 5;
          local_1224 = 5;
          local_1228 = 5;
          local_122c = 5;
          local_1230 = 5;
          auVar2 = vpinsrd_avx(ZEXT416(5),5,1);
          auVar2 = vpinsrd_avx(auVar2,5,2);
          local_1240 = vpinsrd_avx(auVar2,5,3);
          local_e80 = local_1340._0_8_;
          uStack_e78 = local_1340._8_8_;
          local_e90 = local_1240._0_8_;
          uStack_e88 = local_1240._8_8_;
          local_dc0 = local_1340._0_8_;
          uStack_db8 = local_1340._8_8_;
          local_dd0 = local_1240._0_8_;
          uStack_dc8 = local_1240._8_8_;
          local_e60 = vpmulld_avx(local_1340,local_1240);
          local_e48 = local_e70;
          local_1270 = local_e60._0_8_;
          uStack_1268 = local_e60._8_8_;
          local_2230 = local_e60._0_8_;
          uStack_2228 = local_e60._8_8_;
          local_1890 = local_e60._0_8_;
          uStack_1888 = local_e60._8_8_;
          local_1894 = 0x800;
          local_18b0 = local_e60._0_8_;
          uStack_18a8 = local_e60._8_8_;
          local_1860 = local_18c0;
          local_1864 = 0x800;
          local_1854 = 0x800;
          local_1834 = 0x800;
          local_1838 = 0x800;
          local_183c = 0x800;
          local_1840 = 0x800;
          auVar2 = vpinsrd_avx(ZEXT416(0x800),0x800,1);
          auVar2 = vpinsrd_avx(auVar2,0x800,2);
          local_1850 = vpinsrd_avx(auVar2,0x800,3);
          auVar15 = local_1850;
          local_1600 = local_e60._0_8_;
          uStack_15f8 = local_e60._8_8_;
          local_1610 = local_1850._0_8_;
          uStack_1608 = local_1850._8_8_;
          local_14d0 = local_e60._0_8_;
          uStack_14c8 = local_e60._8_8_;
          local_14e0 = local_1850._0_8_;
          uStack_14d8 = local_1850._8_8_;
          local_15e0 = vpsubd_avx(local_e60,local_1850);
          local_15c8 = local_15f0;
          auVar19 = local_15e0;
          local_1880 = local_15e0._0_8_;
          uStack_1878 = local_15e0._8_8_;
          local_2220 = local_15e0._0_8_;
          uStack_2218 = local_15e0._8_8_;
          local_2270 = local_15e0._0_8_;
          uStack_2268 = local_15e0._8_8_;
          local_2280 = local_1630._0_8_;
          uStack_2278 = local_1630._8_8_;
          local_2290 = local_ce0._0_8_;
          uStack_2288 = local_ce0._8_8_;
          local_1d90 = local_15e0._0_8_;
          uStack_1d88 = local_15e0._8_8_;
          local_1da0 = local_1630._0_8_;
          uStack_1d98 = local_1630._8_8_;
          local_1db0 = local_ce0._0_8_;
          uStack_1da8 = local_ce0._8_8_;
          local_16a0 = local_ce0._0_8_;
          uStack_1698 = local_ce0._8_8_;
          local_1dc0 = local_ce0._0_8_;
          uStack_1db8 = local_ce0._8_8_;
          local_120 = local_15e0._0_8_;
          uStack_118 = local_15e0._8_8_;
          local_130 = local_1630._0_8_;
          uStack_128 = local_1630._8_8_;
          local_140 = local_ce0._0_8_;
          uStack_138 = local_ce0._8_8_;
          local_1c30 = vpblendvb_avx(local_15e0,local_1630,local_ce0);
          local_1c18 = local_1d80;
          auVar3 = local_1c30;
          local_2260 = local_1c30._0_8_;
          uStack_2258 = local_1c30._8_8_;
          local_22b0 = local_1c30._0_8_;
          uStack_22a8 = local_1c30._8_8_;
          local_22c0 = local_f00._0_8_;
          uStack_22b8 = local_f00._8_8_;
          local_22d0 = local_d10._0_8_;
          uStack_22c8 = local_d10._8_8_;
          local_1de0 = local_1c30._0_8_;
          uStack_1dd8 = local_1c30._8_8_;
          local_1df0 = local_f00._0_8_;
          uStack_1de8 = local_f00._8_8_;
          local_1e00 = local_d10._0_8_;
          uStack_1df8 = local_d10._8_8_;
          local_1690 = local_d10._0_8_;
          uStack_1688 = local_d10._8_8_;
          local_1e10 = local_d10._0_8_;
          uStack_1e08 = local_d10._8_8_;
          local_f0 = local_1c30._0_8_;
          uStack_e8 = local_1c30._8_8_;
          local_100 = local_f00._0_8_;
          uStack_f8 = local_f00._8_8_;
          local_110 = local_d10._0_8_;
          uStack_108 = local_d10._8_8_;
          local_1c10 = vpblendvb_avx(local_1c30,local_f00,local_d10);
          local_1bf8 = local_1dd0;
          auVar4 = local_1c10;
          local_22a0 = local_1c10._0_8_;
          uStack_2298 = local_1c10._8_8_;
          local_2250 = local_1c10._0_8_;
          uStack_2248 = local_1c10._8_8_;
          local_2300 = local_12e0._0_8_;
          uStack_22f8 = local_12e0._8_8_;
          local_1020 = local_12e0._0_8_;
          uStack_1018 = local_12e0._8_8_;
          local_fe0 = local_12e0._0_8_;
          uStack_fd8 = local_12e0._8_8_;
          local_fe4 = 10;
          local_1000 = vpslld_avx(local_12e0,ZEXT416(10));
          local_ff0 = local_1010;
          local_22f0 = local_1000._0_8_;
          uStack_22e8 = local_1000._8_8_;
          local_2320 = local_1c10._0_8_;
          uStack_2318 = local_1c10._8_8_;
          local_fd0 = local_1c10._0_8_;
          uStack_fc8 = local_1c10._8_8_;
          local_f90 = local_1c10._0_8_;
          uStack_f88 = local_1c10._8_8_;
          local_f94 = 3;
          local_fb0 = vpsrld_avx(local_1c10,ZEXT416(3));
          local_fa0 = local_fc0;
          local_2310 = local_fb0._0_8_;
          uStack_2308 = local_fb0._8_8_;
          local_16f0 = local_1000._0_8_;
          uStack_16e8 = local_1000._8_8_;
          local_1700 = local_fb0._0_8_;
          uStack_16f8 = local_fb0._8_8_;
          local_1470 = local_1000._0_8_;
          uStack_1468 = local_1000._8_8_;
          local_1480 = local_fb0._0_8_;
          uStack_1478 = local_fb0._8_8_;
          local_16d0 = vpor_avx(local_1000,local_fb0);
          local_16b8 = local_16e0;
          auVar17 = local_16d0;
          local_22e0 = local_16d0._0_8_;
          uStack_22d8 = local_16d0._8_8_;
          local_2330 = local_16d0._0_8_;
          uStack_2328 = local_16d0._8_8_;
          local_1ae8 = local_2340;
          local_1aec = 0x7bff;
          local_1a8c = 0x7bff;
          local_1994 = 0x7bff;
          local_1998 = 0x7bff;
          local_199c = 0x7bff;
          local_19a0 = 0x7bff;
          auVar2 = vpinsrd_avx(ZEXT416(0x7bff),0x7bff,1);
          auVar2 = vpinsrd_avx(auVar2,0x7bff,2);
          local_19b0 = vpinsrd_avx(auVar2,0x7bff,3);
          auVar13 = local_19b0;
          local_f70 = local_16d0._0_8_;
          uStack_f68 = local_16d0._8_8_;
          local_f80 = local_19b0._0_8_;
          uStack_f78 = local_19b0._8_8_;
          local_c10 = local_16d0._0_8_;
          uStack_c08 = local_16d0._8_8_;
          local_c20 = local_19b0._0_8_;
          uStack_c18 = local_19b0._8_8_;
          local_f50 = vpminsd_avx(local_16d0,local_19b0);
          local_f38 = local_f60;
          local_2110 = local_f50._0_8_;
          uStack_2108 = local_f50._8_8_;
          local_10f0 = local_2470[(long)local_2484 * 2];
          in_stack_ffffffffffffe0e8 = (vint4 *)local_2470[(long)local_2484 * 2 + 1];
          local_1af8 = local_1ee0;
          local_1afc = 0x3c00;
          local_1a88 = 0x3c00;
          local_19b4 = 0x3c00;
          local_19b8 = 0x3c00;
          local_19bc = 0x3c00;
          local_19c0 = 0x3c00;
          auVar2 = vpinsrd_avx(ZEXT416(0x3c00),0x3c00,1);
          auVar2 = vpinsrd_avx(auVar2,0x3c00,2);
          local_19d0 = vpinsrd_avx(auVar2,0x3c00,3);
          auVar12 = local_19d0;
          local_bc4 = 8;
          auVar7._8_8_ = in_stack_ffffffffffffe0e8;
          auVar7._0_8_ = local_10f0;
          local_be0 = vpslld_avx(auVar7,ZEXT416(8));
          local_bd0 = local_bf0;
          local_1f20 = local_10f0;
          local_1b08 = local_1f30;
          local_1b0c = 0xffff;
          local_1a84 = 0xffff;
          local_19d4 = 0xffff;
          local_19d8 = 0xffff;
          local_19dc = 0xffff;
          local_19e0 = 0xffff;
          auVar2 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffff,2);
          local_19f0 = vpinsrd_avx(auVar2,0xffff,3);
          auVar5 = local_19f0;
          local_bb0 = local_19f0._0_8_;
          uStack_ba8 = local_19f0._8_8_;
          local_460 = local_19f0._0_8_;
          uStack_458 = local_19f0._8_8_;
          auVar10._8_8_ = in_stack_ffffffffffffe0e8;
          auVar10._0_8_ = local_10f0;
          local_b80 = vpcmpeqd_avx(auVar10,local_19f0);
          local_b68 = local_b90;
          local_b60 = local_b80._0_8_;
          uStack_b58 = local_b80._8_8_;
          local_1f50 = local_10f0;
          pvStack_1f48 = in_stack_ffffffffffffe0e8;
          local_1b18 = local_1f60;
          local_1b1c = 4;
          local_1a80 = 4;
          local_19f4 = 4;
          local_19f8 = 4;
          local_19fc = 4;
          local_1a00 = 4;
          auVar2 = vpinsrd_avx(ZEXT416(4),4,1);
          auVar2 = vpinsrd_avx(auVar2,4,2);
          local_1a10 = vpinsrd_avx(auVar2,4,3);
          auVar10 = local_1a10;
          local_1100 = local_1a10._0_8_;
          uStack_10f8 = local_1a10._8_8_;
          local_d30 = local_1a10._0_8_;
          uStack_d28 = local_1a10._8_8_;
          local_c70 = local_1a10._0_8_;
          uStack_c68 = local_1a10._8_8_;
          auVar6._8_8_ = in_stack_ffffffffffffe0e8;
          auVar6._0_8_ = local_10f0;
          local_cb0 = vpcmpgtd_avx(local_1a10,auVar6);
          local_c98 = local_10e0;
          local_c90 = local_cb0._0_8_;
          uStack_c88 = local_cb0._8_8_;
          local_1f40 = local_cb0._0_8_;
          uStack_1f38 = local_cb0._8_8_;
          local_1f90 = local_10f0;
          pvStack_1f88 = in_stack_ffffffffffffe0e8;
          local_3a4 = 8;
          auVar11._8_8_ = in_stack_ffffffffffffe0e8;
          auVar11._0_8_ = local_10f0;
          local_3c0 = vpsrld_avx(auVar11,ZEXT416(8));
          local_3b0 = local_3d0;
          local_ab0 = local_3c0._0_8_;
          uStack_aa8 = local_3c0._8_8_;
          local_440 = local_3c0._0_8_;
          uStack_438 = local_3c0._8_8_;
          local_404 = 0xffffffff;
          local_3e4 = 0xffffffff;
          local_3e8 = 0xffffffff;
          local_3ec = 0xffffffff;
          local_3f0 = 0xffffffff;
          auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
          local_400 = vpinsrd_avx(auVar2,0xffffffff,3);
          local_230 = local_3c0._0_8_;
          uStack_228 = local_3c0._8_8_;
          local_240 = local_400._0_8_;
          uStack_238 = local_400._8_8_;
          local_aa0 = local_3c0._0_8_ ^ local_400._0_8_;
          uStack_a98 = local_3c0._8_8_ ^ local_400._8_8_;
          local_410 = local_430;
          auVar9._8_8_ = uStack_a98;
          auVar9._0_8_ = local_aa0;
          auVar8._8_8_ = in_stack_ffffffffffffe0e8;
          auVar8._0_8_ = local_10f0;
          local_920 = vpand_avx(auVar9,auVar8);
          local_908 = local_930;
          local_a90 = local_920._0_8_;
          uStack_a88 = local_920._8_8_;
          local_b00 = local_920._0_8_;
          uStack_af8 = local_920._8_8_;
          local_a60 = local_920._0_8_;
          uStack_a58 = local_920._8_8_;
          local_a20 = local_920._0_8_;
          uStack_a18 = local_920._8_8_;
          local_a40 = vcvtdq2ps_avx(local_920);
          local_a28 = local_a50;
          local_af0 = local_a40._0_8_;
          uStack_ae8 = local_a40._8_8_;
          local_9d0 = local_a40._0_8_;
          uStack_9c8 = local_a40._8_8_;
          local_900 = local_a40._0_8_;
          uStack_8f8 = local_a40._8_8_;
          local_998 = local_9c0;
          local_9b0 = local_a40._0_8_;
          uStack_9a8 = local_a40._8_8_;
          local_ae0 = local_a40._0_8_;
          uStack_ad8 = local_a40._8_8_;
          local_a00 = local_b20;
          local_a04 = 0x9e;
          local_9f4 = 0x9e;
          local_9d4 = 0x9e;
          local_9d8 = 0x9e;
          local_9dc = 0x9e;
          local_9e0 = 0x9e;
          auVar2 = vpinsrd_avx(ZEXT416(0x9e),0x9e,1);
          auVar2 = vpinsrd_avx(auVar2,0x9e,2);
          local_9f0 = vpinsrd_avx(auVar2,0x9e,3);
          local_b40 = local_a40._0_8_;
          uStack_b38 = local_a40._8_8_;
          local_990 = local_a40._0_8_;
          uStack_988 = local_a40._8_8_;
          local_870 = local_a40._0_8_;
          uStack_868 = local_a40._8_8_;
          local_874 = 0x17;
          local_970 = vpsrld_avx(local_a40,ZEXT416(0x17));
          local_958 = local_980;
          local_b30 = local_970._0_8_;
          uStack_b28 = local_970._8_8_;
          local_8e0 = local_9f0._0_8_;
          uStack_8d8 = local_9f0._8_8_;
          local_8f0 = local_970._0_8_;
          uStack_8e8 = local_970._8_8_;
          local_890 = local_9f0._0_8_;
          uStack_888 = local_9f0._8_8_;
          local_8a0 = local_970._0_8_;
          uStack_898 = local_970._8_8_;
          local_8c0 = vpsubd_avx(local_9f0,local_970);
          local_8a8 = local_8d0;
          local_b10 = local_8c0._0_8_;
          uStack_b08 = local_8c0._8_8_;
          local_a80 = local_8c0._0_8_;
          uStack_a78 = local_8c0._8_8_;
          local_b50 = local_8c0._0_8_;
          uStack_b48 = local_8c0._8_8_;
          local_340 = local_8c0._0_8_;
          uStack_338 = local_8c0._8_8_;
          local_344 = 0;
          local_348 = 0x20;
          local_370 = local_8c0._0_8_;
          uStack_368 = local_8c0._8_8_;
          local_310 = local_380;
          local_314 = 0;
          local_2f4 = 0;
          local_2d4 = 0;
          local_2d8 = 0;
          local_2dc = 0;
          local_2e0 = 0;
          auVar2 = vpinsrd_avx(ZEXT416(0),0,1);
          auVar2 = vpinsrd_avx(auVar2,0,2);
          local_2f0 = vpinsrd_avx(auVar2,0,3);
          local_210 = local_8c0._0_8_;
          uStack_208 = local_8c0._8_8_;
          local_220 = local_2f0._0_8_;
          uStack_218 = local_2f0._8_8_;
          local_1c0 = local_8c0._0_8_;
          uStack_1b8 = local_8c0._8_8_;
          local_1d0 = local_2f0._0_8_;
          uStack_1c8 = local_2f0._8_8_;
          local_1f0 = vpmaxsd_avx(local_8c0,local_2f0);
          local_1d8 = local_200;
          local_360 = local_1f0._0_8_;
          uStack_358 = local_1f0._8_8_;
          local_300 = local_390;
          local_304 = 0x20;
          local_2f8 = 0x20;
          local_2b4 = 0x20;
          local_2b8 = 0x20;
          local_2bc = 0x20;
          local_2c0 = 0x20;
          auVar2 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
          auVar2 = vpinsrd_avx(auVar2,0x20,2);
          local_2d0 = vpinsrd_avx(auVar2,0x20,3);
          local_2a0 = local_1f0._0_8_;
          uStack_298 = local_1f0._8_8_;
          local_2b0 = local_2d0._0_8_;
          uStack_2a8 = local_2d0._8_8_;
          local_250 = local_1f0._0_8_;
          uStack_248 = local_1f0._8_8_;
          local_260 = local_2d0._0_8_;
          uStack_258 = local_2d0._8_8_;
          local_280 = vpminsd_avx(local_1f0,local_2d0);
          local_268 = local_290;
          local_330 = local_280._0_8_;
          uStack_328 = local_280._8_8_;
          local_a70 = local_280._0_8_;
          uStack_a68 = local_280._8_8_;
          local_1f80 = local_280._0_8_;
          uStack_1f78 = local_280._8_8_;
          local_1920 = local_280._0_8_;
          uStack_1918 = local_280._8_8_;
          local_1924 = 0x10;
          local_1940 = local_280._0_8_;
          uStack_1938 = local_280._8_8_;
          local_18f0 = local_1950;
          local_18f4 = 0x10;
          local_18e4 = 0x10;
          local_18c4 = 0x10;
          local_18c8 = 0x10;
          local_18cc = 0x10;
          local_18d0 = 0x10;
          auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
          auVar2 = vpinsrd_avx(auVar2,0x10,2);
          local_18e0 = vpinsrd_avx(auVar2,0x10,3);
          auVar8 = local_18e0;
          local_15b0 = local_280._0_8_;
          uStack_15a8 = local_280._8_8_;
          local_15c0 = local_18e0._0_8_;
          uStack_15b8 = local_18e0._8_8_;
          local_14f0 = local_280._0_8_;
          uStack_14e8 = local_280._8_8_;
          local_1500 = local_18e0._0_8_;
          uStack_14f8 = local_18e0._8_8_;
          local_1590 = vpsubd_avx(local_280,local_18e0);
          local_1578 = local_15a0;
          auVar9 = local_1590;
          local_1910 = local_1590._0_8_;
          uStack_1908 = local_1590._8_8_;
          local_1f70 = local_1590._0_8_;
          uStack_1f68 = local_1590._8_8_;
          local_1fb0 = local_10f0;
          pvStack_1fa8 = in_stack_ffffffffffffe0e8;
          local_1fe0 = local_1590._0_8_;
          uStack_1fd8 = local_1590._8_8_;
          local_1c90 = local_1590._0_8_;
          uStack_1c88 = local_1590._8_8_;
          local_1c94 = 1;
          local_1cb0 = local_1590._0_8_;
          uStack_1ca8 = local_1590._8_8_;
          local_1b48 = local_1cc0;
          local_1b4c = 1;
          local_1a74 = 1;
          local_1a54 = 1;
          local_1a58 = 1;
          local_1a5c = 1;
          local_1a60 = 1;
          auVar2 = vpinsrd_avx(ZEXT416(1),1,1);
          auVar2 = vpinsrd_avx(auVar2,1,2);
          local_1a70 = vpinsrd_avx(auVar2,1,3);
          auVar7 = local_1a70;
          local_1b90 = local_1590._0_8_;
          uStack_1b88 = local_1590._8_8_;
          local_1ba0 = local_1a70._0_8_;
          uStack_1b98 = local_1a70._8_8_;
          local_1ab0 = local_1590._0_8_;
          uStack_1aa8 = local_1590._8_8_;
          local_1ac0 = local_1a70._0_8_;
          uStack_1ab8 = local_1a70._8_8_;
          local_1b70 = vpaddd_avx(local_1590,local_1a70);
          local_1b58 = local_1b80;
          auVar6 = local_1b70;
          local_1c80 = local_1b70._0_8_;
          uStack_1c78 = local_1b70._8_8_;
          local_1fd0 = local_1b70._0_8_;
          uStack_1fc8 = local_1b70._8_8_;
          local_7a0 = local_1b70._0_8_;
          uStack_798 = local_1b70._8_8_;
          local_7c0 = local_1b70._0_8_;
          uStack_7b8 = local_1b70._8_8_;
          local_5c8 = local_7d0;
          local_5cc = 0x1f;
          local_598 = 0x1f;
          local_554 = 0x1f;
          local_558 = 0x1f;
          local_55c = 0x1f;
          local_560 = 0x1f;
          auVar2 = vpinsrd_avx(ZEXT416(0x1f),0x1f,1);
          auVar2 = vpinsrd_avx(auVar2,0x1f,2);
          local_570 = vpinsrd_avx(auVar2,0x1f,3);
          local_540 = local_1b70._0_8_;
          uStack_538 = local_1b70._8_8_;
          local_550 = local_570._0_8_;
          uStack_548 = local_570._8_8_;
          local_510 = local_1b70._0_8_;
          uStack_508 = local_1b70._8_8_;
          local_520 = local_570._0_8_;
          uStack_518 = local_570._8_8_;
          local_4c0 = local_570._0_8_;
          uStack_4b8 = local_570._8_8_;
          local_4d0 = local_1b70._0_8_;
          uStack_4c8 = local_1b70._8_8_;
          local_500 = vpcmpgtd_avx(local_570,local_1b70);
          local_4e8 = local_530;
          local_4e0 = local_500._0_8_;
          uStack_4d8 = local_500._8_8_;
          local_7b0 = local_500._0_8_;
          uStack_7a8 = local_500._8_8_;
          local_1a0 = local_500._0_8_;
          uStack_198 = local_500._8_8_;
          local_1b0 = local_500._0_8_;
          uStack_1a8 = local_500._8_8_;
          local_190 = local_500._0_8_;
          uStack_188 = local_500._8_8_;
          local_180 = local_500._0_8_;
          uStack_178 = local_500._8_8_;
          iVar24 = vmovmskps_avx(local_500);
          local_1c30 = auVar3;
          local_1c10 = auVar4;
          local_1a70 = auVar7;
          local_1a10 = auVar10;
          local_19f0 = auVar5;
          local_19b0 = auVar13;
          local_1990 = auVar14;
          local_1970 = auVar25;
          local_18e0 = auVar8;
          local_1850 = auVar15;
          local_17c0 = auVar16;
          local_16d0 = auVar17;
          local_1630 = auVar18;
          local_15e0 = auVar19;
          local_13d0 = local_13f0;
          uStack_13c8 = uStack_13e8;
          local_1360 = local_13f0;
          uStack_1358 = uStack_13e8;
          local_1310 = local_13f0;
          uStack_1308 = uStack_13e8;
          local_1300 = local_13f0;
          uStack_12f8 = uStack_13e8;
          local_12c0 = local_13f0;
          uStack_12b8 = uStack_13e8;
          pvStack_10e8 = in_stack_ffffffffffffe0e8;
          local_d20 = local_10f0;
          pvStack_d18 = in_stack_ffffffffffffe0e8;
          local_c80 = local_10f0;
          pvStack_c78 = in_stack_ffffffffffffe0e8;
          local_c00 = local_10f0;
          pvStack_bf8 = in_stack_ffffffffffffe0e8;
          local_bc0 = local_10f0;
          pvStack_bb8 = in_stack_ffffffffffffe0e8;
          local_ba0 = local_10f0;
          pvStack_b98 = in_stack_ffffffffffffe0e8;
          local_ad0 = local_10f0;
          pvStack_ac8 = in_stack_ffffffffffffe0e8;
          local_ac0 = local_10f0;
          pvStack_ab8 = in_stack_ffffffffffffe0e8;
          local_950 = local_10f0;
          pvStack_948 = in_stack_ffffffffffffe0e8;
          local_940 = local_aa0;
          uStack_938 = uStack_a98;
          local_860 = local_10f0;
          pvStack_858 = in_stack_ffffffffffffe0e8;
          local_850 = local_aa0;
          uStack_848 = uStack_a98;
          local_450 = local_10f0;
          pvStack_448 = in_stack_ffffffffffffe0e8;
          local_420 = local_aa0;
          uStack_418 = uStack_a98;
          local_3e0 = local_10f0;
          pvStack_3d8 = in_stack_ffffffffffffe0e8;
          local_3a0 = local_10f0;
          pvStack_398 = in_stack_ffffffffffffe0e8;
          if (iVar24 != 0xf) {
            local_1ed0 = local_10f0;
            pvStack_1ec8 = in_stack_ffffffffffffe0e8;
            local_1b70 = auVar6;
            local_19d0 = auVar12;
            local_1590 = auVar9;
            local_1420 = auVar1;
            __assert_fail("all(a < vint4(31))",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_vecmathlib.h"
                          ,0x1e1,"vint4 two_to_the_n(vint4)");
          }
          local_7f0 = local_1b70._0_8_;
          uStack_7e8 = local_1b70._8_8_;
          local_6f0 = local_1b70._0_8_;
          uStack_6e8 = local_1b70._8_8_;
          local_6f4 = 0x7f;
          local_710 = local_1b70._0_8_;
          uStack_708 = local_1b70._8_8_;
          local_5d8 = local_720;
          local_5dc = 0x7f;
          local_594 = 0x7f;
          local_574 = 0x7f;
          local_578 = 0x7f;
          local_57c = 0x7f;
          local_580 = 0x7f;
          auVar2 = vpinsrd_avx(ZEXT416(0x7f),0x7f,1);
          auVar2 = vpinsrd_avx(auVar2,0x7f,2);
          local_590 = vpinsrd_avx(auVar2,0x7f,3);
          local_620 = local_1b70._0_8_;
          uStack_618 = local_1b70._8_8_;
          local_630 = local_590._0_8_;
          uStack_628 = local_590._8_8_;
          local_5b0 = local_1b70._0_8_;
          uStack_5a8 = local_1b70._8_8_;
          local_5c0 = local_590._0_8_;
          uStack_5b8 = local_590._8_8_;
          local_600 = vpaddd_avx(local_1b70,local_590);
          local_5e8 = local_610;
          local_6e0 = local_600._0_8_;
          uStack_6d8 = local_600._8_8_;
          local_810 = local_600._0_8_;
          uStack_808 = local_600._8_8_;
          local_740 = local_600._0_8_;
          uStack_738 = local_600._8_8_;
          local_640 = local_600._0_8_;
          uStack_638 = local_600._8_8_;
          local_644 = 0x17;
          local_6a0 = vpslld_avx(local_600,ZEXT416(0x17));
          local_688 = local_730;
          local_800 = local_6a0._0_8_;
          uStack_7f8 = local_6a0._8_8_;
          local_7e0 = local_6a0._0_8_;
          uStack_7d8 = local_6a0._8_8_;
          local_830 = local_6a0._0_8_;
          uStack_828 = local_6a0._8_8_;
          local_760 = local_6a0._0_8_;
          uStack_758 = local_6a0._8_8_;
          local_660 = local_6a0._0_8_;
          uStack_658 = local_6a0._8_8_;
          local_6b8 = local_750;
          local_6d0 = local_6a0._0_8_;
          uStack_6c8 = local_6a0._8_8_;
          local_820 = local_6a0._0_8_;
          uStack_818 = local_6a0._8_8_;
          local_840 = local_6a0._0_8_;
          uStack_838 = local_6a0._8_8_;
          local_780 = local_6a0._0_8_;
          uStack_778 = local_6a0._8_8_;
          local_6b0 = local_6a0._0_8_;
          uVar20 = local_6b0;
          uStack_6a8 = local_6a0._8_8_;
          uVar21 = uStack_6a8;
          local_6b0._0_4_ = local_6a0._0_4_;
          local_6b0._4_4_ = local_6a0._4_4_;
          uStack_6a8._0_4_ = local_6a0._8_4_;
          uStack_6a8._4_4_ = local_6a0._12_4_;
          local_680 = (int)(float)local_6b0;
          iStack_67c = (int)local_6b0._4_4_;
          iStack_678 = (int)(float)uStack_6a8;
          iStack_674 = (int)uStack_6a8._4_4_;
          local_668 = local_770;
          local_e40 = CONCAT44(iStack_67c,local_680);
          uStack_e38 = CONCAT44(iStack_674,iStack_678);
          local_1fc0 = local_e40;
          uStack_1fb8 = uStack_e38;
          auVar5._8_8_ = in_stack_ffffffffffffe0e8;
          auVar5._0_8_ = local_10f0;
          auVar4._8_8_ = uStack_e38;
          auVar4._0_8_ = local_e40;
          local_e10 = vpmulld_avx(auVar5,auVar4);
          local_df8 = local_e20;
          local_1fa0 = local_e10._0_8_;
          uStack_1f98 = local_e10._8_8_;
          local_2000 = local_e10._0_8_;
          uStack_1ff8 = local_e10._8_8_;
          local_1b28 = local_2010;
          local_1b2c = 0xffff;
          local_1a7c = 0xffff;
          local_1a14 = 0xffff;
          local_1a18 = 0xffff;
          local_1a1c = 0xffff;
          local_1a20 = 0xffff;
          auVar2 = vpinsrd_avx(ZEXT416(0xffff),0xffff,1);
          auVar2 = vpinsrd_avx(auVar2,0xffff,2);
          local_1a30 = vpinsrd_avx(auVar2,0xffff,3);
          auVar4 = local_1a30;
          local_1790 = local_e10._0_8_;
          uStack_1788 = local_e10._8_8_;
          local_17a0 = local_1a30._0_8_;
          uStack_1798 = local_1a30._8_8_;
          local_1490 = local_e10._0_8_;
          uStack_1488 = local_e10._8_8_;
          local_14a0 = local_1a30._0_8_;
          uStack_1498 = local_1a30._8_8_;
          local_1770 = vpand_avx(local_e10,local_1a30);
          local_1758 = local_1780;
          auVar5 = local_1770;
          local_1ff0 = local_1770._0_8_;
          uStack_1fe8 = local_1770._8_8_;
          local_2030 = local_1770._0_8_;
          uStack_2028 = local_1770._8_8_;
          local_4b0 = local_1770._0_8_;
          uStack_4a8 = local_1770._8_8_;
          local_470 = local_1770._0_8_;
          uStack_468 = local_1770._8_8_;
          local_474 = 6;
          local_490 = vpsrld_avx(local_1770,ZEXT416(6));
          local_480 = local_4a0;
          local_2020 = local_490._0_8_;
          uStack_2018 = local_490._8_8_;
          local_2050 = local_490._0_8_;
          uStack_2048 = local_490._8_8_;
          local_1b38 = local_2080;
          local_1b3c = 0xe;
          local_1a78 = 0xe;
          local_1a34 = 0xe;
          local_1a38 = 0xe;
          local_1a3c = 0xe;
          local_1a40 = 0xe;
          auVar2 = vpinsrd_avx(ZEXT416(0xe),0xe,1);
          auVar2 = vpinsrd_avx(auVar2,0xe,2);
          local_1a50 = vpinsrd_avx(auVar2,0xe,3);
          auVar11 = local_1a50;
          local_2090 = local_1590._0_8_;
          uStack_2088 = local_1590._8_8_;
          local_1560 = local_1a50._0_8_;
          uStack_1558 = local_1a50._8_8_;
          local_1570 = local_1590._0_8_;
          uStack_1568 = local_1590._8_8_;
          local_1510 = local_1a50._0_8_;
          uStack_1508 = local_1a50._8_8_;
          local_1520 = local_1590._0_8_;
          uStack_1518 = local_1590._8_8_;
          local_1540 = vpsubd_avx(local_1a50,local_1590);
          local_1528 = local_1550;
          auVar14 = local_1540;
          local_2070 = local_1540._0_8_;
          uStack_2068 = local_1540._8_8_;
          local_1070 = local_1540._0_8_;
          uStack_1068 = local_1540._8_8_;
          local_1030 = local_1540._0_8_;
          uStack_1028 = local_1540._8_8_;
          local_1034 = 10;
          local_1050 = vpslld_avx(local_1540,ZEXT416(10));
          local_1040 = local_1060;
          local_2060 = local_1050._0_8_;
          uStack_2058 = local_1050._8_8_;
          local_1740 = local_490._0_8_;
          uStack_1738 = local_490._8_8_;
          local_1750 = local_1050._0_8_;
          uStack_1748 = local_1050._8_8_;
          local_1450 = local_490._0_8_;
          uStack_1448 = local_490._8_8_;
          local_1460 = local_1050._0_8_;
          uStack_1458 = local_1050._8_8_;
          local_1720 = vpor_avx(local_490,local_1050);
          local_1708 = local_1730;
          auVar13 = local_1720;
          local_2040 = local_1720._0_8_;
          uStack_2038 = local_1720._8_8_;
          local_1ed0 = local_1720._0_8_;
          pvStack_1ec8 = (vint4 *)local_1720._8_8_;
          local_20a0 = local_1720._0_8_;
          uStack_2098 = local_1720._8_8_;
          local_20b0 = local_19d0._0_8_;
          uStack_20a8 = local_19d0._8_8_;
          local_20c0 = local_b80._0_8_;
          uStack_20b8 = local_b80._8_8_;
          local_1e30 = local_1720._0_8_;
          uStack_1e28 = local_1720._8_8_;
          local_1e40 = local_19d0._0_8_;
          uStack_1e38 = local_19d0._8_8_;
          local_1e50 = local_b80._0_8_;
          uStack_1e48 = local_b80._8_8_;
          local_1680 = local_b80._0_8_;
          uStack_1678 = local_b80._8_8_;
          local_1e60 = local_b80._0_8_;
          uStack_1e58 = local_b80._8_8_;
          local_c0 = local_1720._0_8_;
          uStack_b8 = local_1720._8_8_;
          local_d0 = local_19d0._0_8_;
          uStack_c8 = local_19d0._8_8_;
          local_e0 = local_b80._0_8_;
          uStack_d8 = local_b80._8_8_;
          local_1bf0 = vpblendvb_avx(local_1720,local_19d0,local_b80);
          local_1bd8 = local_1e20;
          auVar8 = local_1bf0;
          local_20e0 = local_1bf0._0_8_;
          uStack_20d8 = local_1bf0._8_8_;
          local_20f0 = local_be0._0_8_;
          uStack_20e8 = local_be0._8_8_;
          local_2100 = local_cb0._0_8_;
          uStack_20f8 = local_cb0._8_8_;
          local_1e80 = local_1bf0._0_8_;
          uStack_1e78 = local_1bf0._8_8_;
          local_1e90 = local_be0._0_8_;
          uStack_1e88 = local_be0._8_8_;
          local_1ea0 = local_cb0._0_8_;
          uStack_1e98 = local_cb0._8_8_;
          local_1670 = local_cb0._0_8_;
          uStack_1668 = local_cb0._8_8_;
          local_1eb0 = local_cb0._0_8_;
          uStack_1ea8 = local_cb0._8_8_;
          local_90 = local_1bf0._0_8_;
          uStack_88 = local_1bf0._8_8_;
          local_a0 = local_be0._0_8_;
          uStack_98 = local_be0._8_8_;
          local_b0 = local_cb0._0_8_;
          uStack_a8 = local_cb0._8_8_;
          local_1bd0 = vpblendvb_avx(local_1bf0,local_be0,local_cb0);
          local_1bb8 = local_1e70;
          auVar10 = local_1bd0;
          local_20d0 = local_1bd0._0_8_;
          uStack_20c8 = local_1bd0._8_8_;
          local_1ec0 = local_1bd0._0_8_;
          uStack_1eb8 = local_1bd0._8_8_;
          local_1d40 = local_1bd0._0_8_;
          uStack_1d38 = local_1bd0._8_8_;
          local_1d50 = local_f50._0_8_;
          uStack_1d48 = local_f50._8_8_;
          local_1d60 = local_1420._0_8_;
          uStack_1d58 = local_1420._8_8_;
          local_16b0 = local_1420._0_8_;
          uStack_16a8 = local_1420._8_8_;
          local_1d70 = local_1420._0_8_;
          uStack_1d68 = local_1420._8_8_;
          local_150 = local_1bd0._0_8_;
          uStack_148 = local_1bd0._8_8_;
          local_160 = local_f50._0_8_;
          uStack_158 = local_f50._8_8_;
          local_170 = local_1420._0_8_;
          uStack_168 = local_1420._8_8_;
          local_1c50 = vpblendvb_avx(local_1bd0,local_f50,local_1420);
          local_1c38 = local_1d30;
          auVar7 = local_1c50;
          local_1ce0 = local_1c50._0_8_;
          uStack_1cd8 = local_1c50._8_8_;
          local_50 = local_1c50._0_8_;
          uStack_48 = local_1c50._8_8_;
          local_60 = local_1c50._0_8_;
          uStack_58 = local_1c50._8_8_;
          local_1cf0 = vpackssdw_avx(local_1c50,local_1c50);
          auVar3 = local_1cf0;
          local_40 = local_1cf0._0_8_;
          uStack_38 = local_1cf0._8_8_;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_1cf0._0_8_;
          local_1d00 = vcvtph2ps_f16c(auVar25);
          auVar2 = local_1d00;
          local_1c58 = local_1cd0;
          local_1c70 = local_1d00._0_8_;
          uStack_1c68 = local_1d00._8_8_;
          local_68 = (undefined8 *)
                     (local_2380 + (ulong)local_244c * 8 + (long)local_2484 * 4 + 0x12);
          local_1d10 = local_1d00._0_8_;
          uStack_1d08 = local_1d00._8_8_;
          local_1d18 = local_68;
          *local_68 = local_1d00._0_8_;
          local_68[1] = local_1d00._8_8_;
          local_1d00 = auVar2;
          local_1cf0 = auVar3;
          local_1c50 = auVar7;
          local_1bf0 = auVar8;
          local_1bd0 = auVar10;
          local_1b70 = auVar6;
          local_1a50 = auVar11;
          local_1a30 = auVar4;
          local_19d0 = auVar12;
          local_1770 = auVar5;
          local_1720 = auVar13;
          local_1590 = auVar9;
          local_1540 = auVar14;
          local_e30 = local_10f0;
          pvStack_e28 = in_stack_ffffffffffffe0e8;
          local_df0 = local_e40;
          uStack_de8 = uStack_e38;
          local_de0 = local_10f0;
          pvStack_dd8 = in_stack_ffffffffffffe0e8;
          local_790 = local_e40;
          uStack_788 = uStack_e38;
          local_6b0 = uVar20;
          uStack_6a8 = uVar21;
        }
        local_1420 = auVar1;
      }
      unpack_weights(in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8,in_stack_ffffffffffffd9a0,
                     (bool)in_stack_ffffffffffffd99f,in_stack_ffffffffffffd990,
                     in_stack_ffffffffffffd988);
      for (uVar23 = 0; uVar23 < local_2428->texel_count; uVar23 = uVar23 + 1) {
        local_2380[(ulong)uVar23 + 0x32] = (float)local_2890[uVar23] * 0.0625;
        if ((*(byte *)((long)local_2380 + 0x17) & 1) != 0) {
          local_2380[(ulong)uVar23 + 0x10a] = (float)local_2bf0[uVar23] * 0.0625;
        }
      }
      for (uVar23 = 0; uVar23 < local_2428->texel_count; uVar23 = uVar23 + 1) {
        *(uint8_t *)((long)local_2380 + (ulong)uVar23 + 0x788) =
             local_2438->partition_of_texel[uVar23];
      }
    }
  }
  return ASTCENC_SUCCESS;
}

Assistant:

astcenc_error astcenc_get_block_info(
	astcenc_context* ctxo,
	const uint8_t data[16],
	astcenc_block_info* info
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)data;
	(void)info;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;

	// Decode the compressed data into a symbolic form
	symbolic_compressed_block scb;
	physical_to_symbolic(*ctx->bsd, data, scb);

	// Fetch the appropriate partition and decimation tables
	block_size_descriptor& bsd = *ctx->bsd;

	// Start from a clean slate
	memset(info, 0, sizeof(*info));

	// Basic info we can always populate
	info->profile = ctx->config.profile;

	info->block_x = ctx->config.block_x;
	info->block_y = ctx->config.block_y;
	info->block_z = ctx->config.block_z;
	info->texel_count = bsd.texel_count;

	// Check for error blocks first
	info->is_error_block = scb.block_type == SYM_BTYPE_ERROR;
	if (info->is_error_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Check for constant color blocks second
	info->is_constant_block = scb.block_type == SYM_BTYPE_CONST_F16 ||
	                          scb.block_type == SYM_BTYPE_CONST_U16;
	if (info->is_constant_block)
	{
		return ASTCENC_SUCCESS;
	}

	// Otherwise handle a full block ; known to be valid after conditions above have been checked
	int partition_count = scb.partition_count;
	const auto& pi = bsd.get_partition_info(partition_count, scb.partition_index);

	const block_mode& bm = bsd.get_block_mode(scb.block_mode);
	const decimation_info& di = bsd.get_decimation_info(bm.decimation_mode);

	info->weight_x = di.weight_x;
	info->weight_y = di.weight_y;
	info->weight_z = di.weight_z;

	info->is_dual_plane_block = bm.is_dual_plane != 0;

	info->partition_count = scb.partition_count;
	info->partition_index = scb.partition_index;
	info->dual_plane_component = scb.plane2_component;

	info->color_level_count = get_quant_level(scb.get_color_quant_mode());
	info->weight_level_count = get_quant_level(bm.get_weight_quant_mode());

	// Unpack color endpoints for each active partition
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		bool rgb_hdr;
		bool a_hdr;
		vint4 endpnt[2];

		unpack_color_endpoints(ctx->config.profile,
		                       scb.color_formats[i],
		                       scb.color_values[i],
		                       rgb_hdr, a_hdr,
		                       endpnt[0], endpnt[1]);

		// Store the color endpoint mode info
		info->color_endpoint_modes[i] = scb.color_formats[i];
		info->is_hdr_block = info->is_hdr_block || rgb_hdr || a_hdr;

		// Store the unpacked and decoded color endpoint
		vmask4 hdr_mask(rgb_hdr, rgb_hdr, rgb_hdr, a_hdr);
		for (int j = 0; j < 2; j++)
		{
			vint4 color_lns = lns_to_sf16(endpnt[j]);
			vint4 color_unorm = unorm16_to_sf16(endpnt[j]);
			vint4 datai = select(color_unorm, color_lns, hdr_mask);
			store(float16_to_float(datai), info->color_endpoints[i][j]);
		}
	}

	// Unpack weights for each texel
	int weight_plane1[BLOCK_MAX_TEXELS];
	int weight_plane2[BLOCK_MAX_TEXELS];

	unpack_weights(bsd, scb, di, bm.is_dual_plane, weight_plane1, weight_plane2);
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->weight_values_plane1[i] = static_cast<float>(weight_plane1[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		if (info->is_dual_plane_block)
		{
			info->weight_values_plane2[i] = static_cast<float>(weight_plane2[i]) * (1.0f / WEIGHTS_TEXEL_SUM);
		}
	}

	// Unpack partition assignments for each texel
	for (unsigned int i = 0; i < bsd.texel_count; i++)
	{
		info->partition_assignment[i] = pi.partition_of_texel[i];
	}

	return ASTCENC_SUCCESS;
#endif
}